

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::SpecparamSymbol::resolvePathPulse(SpecparamSymbol *this)

{
  long lVar1;
  long *plVar2;
  Scope *parent;
  SpecparamSymbol *pSVar3;
  Diagnostic *this_00;
  Symbol *pSVar4;
  size_type __n;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  SpecparamSymbol *this_01;
  SourceLocation loc;
  SpecparamSymbol *__s;
  string_view arg;
  string_view terminalName;
  string_view terminalName_00;
  SourceRange sourceRange;
  
  this->pathPulseResolved = true;
  if ((((this->isPathPulse != true) ||
       (uVar5 = (this->super_ValueSymbol).super_Symbol.name._M_len, uVar5 < 10)) ||
      (plVar2 = (long *)(this->super_ValueSymbol).super_Symbol.name._M_str,
      (short)plVar2[1] != 0x2445 || *plVar2 != 0x534c555048544150)) ||
     ((parent = (this->super_ValueSymbol).super_Symbol.parentScope,
      parent->thisSym->kind != SpecifyBlock || (uVar5 = uVar5 - 10, uVar5 == 0)))) {
    return;
  }
  __s = (SpecparamSymbol *)((long)plVar2 + 10);
  loc = (SourceLocation)((long)(this->super_ValueSymbol).super_Symbol.location + 0xa0000000);
  this_01 = __s;
  pSVar3 = (SpecparamSymbol *)memchr(__s,0x24,uVar5);
  uVar6 = (long)pSVar3 - (long)__s;
  if (uVar6 != 0xffffffffffffffff && pSVar3 != (SpecparamSymbol *)0x0) {
    lVar1 = uVar6 + 1;
    uVar7 = uVar6;
    if (uVar5 < uVar6) {
      uVar7 = uVar5;
    }
    if (uVar5 <= uVar6) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 lVar1,uVar5);
    }
    terminalName_00._M_len = uVar5 - lVar1;
    if (pSVar3 != __s && terminalName_00._M_len != 0) {
      terminalName_00._M_str = (char *)(lVar1 + (long)__s);
      terminalName._M_str = (char *)__s;
      terminalName._M_len = uVar7;
      pSVar4 = resolvePathTerminal(this_01,terminalName,parent,loc,true);
      this->pathSource = pSVar4;
      pSVar4 = resolvePathTerminal(this_01,terminalName_00,parent,
                                   (SourceLocation)(uVar7 * 0x10000000 + (long)loc),false);
      this->pathDest = pSVar4;
      return;
    }
  }
  sourceRange.endLoc = (SourceLocation)(uVar5 * 0x10000000 + (long)loc);
  sourceRange.startLoc = loc;
  this_00 = Scope::addDiag(parent,(DiagCode)0x9a0006,sourceRange);
  arg._M_str = (char *)__s;
  arg._M_len = uVar5;
  Diagnostic::operator<<(this_00,arg);
  return;
}

Assistant:

void SpecparamSymbol::resolvePathPulse() const {
    pathPulseResolved = true;
    if (!isPathPulse)
        return;

    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    auto prefix = "PATHPULSE$"sv;
    if (name.starts_with(prefix) && parent->asSymbol().kind == SymbolKind::SpecifyBlock) {
        auto path = name.substr(prefix.length());
        if (!path.empty()) {
            auto loc = location + prefix.length();
            auto nameError = [&] {
                parent->addDiag(diag::PathPulseInvalidPathName,
                                SourceRange{loc, loc + path.length()})
                    << path;
            };

            auto index = path.find('$');
            if (index == std::string_view::npos) {
                nameError();
                return;
            }

            auto source = path.substr(0, index);
            auto dest = path.substr(index + 1);
            if (source.empty() || dest.empty()) {
                nameError();
                return;
            }

            pathSource = resolvePathTerminal(source, *parent, loc,
                                             /* isSource */ true);
            pathDest = resolvePathTerminal(dest, *parent, loc + source.length(),
                                           /* isSource */ false);
        }
    }
}